

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::BlendCase::BlendCase
          (BlendCase *this,Context *context,char *name,char *desc,
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          *paramSets)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlendCase_0212d8e0;
  std::
  vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
  ::vector(&this->m_paramSets,paramSets);
  this->m_curParamSetNdx = 0;
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_referenceRenderer = (ReferenceQuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  *(undefined8 *)(this->m_firstQuad).posA.m_data = 0xbf800000bf800000;
  *(undefined8 *)(this->m_firstQuad).posB.m_data = 0x3f8000003f800000;
  memset((this->m_firstQuad).color,0,0x90);
  *(undefined8 *)(this->m_secondQuad).posA.m_data = 0xbf800000bf800000;
  *(undefined8 *)(this->m_secondQuad).posB.m_data = 0x3f8000003f800000;
  memset((this->m_secondQuad).color,0,0x98);
  *(undefined1 **)(this->m_firstQuadInt).posB.m_data = &DAT_100000001;
  memset((this->m_firstQuadInt).color,0,0x98);
  *(undefined1 **)(this->m_secondQuadInt).posB.m_data = &DAT_100000001;
  memset((this->m_secondQuadInt).color,0,0x98);
  return;
}

Assistant:

BlendCase::BlendCase (Context&						context,
					  const char*					name,
					  const char*					desc,
					  const vector<BlendParams>&	paramSets)
	: TestCase				(context, name, desc)
	, m_paramSets			(paramSets)
	, m_curParamSetNdx		(0)
	, m_renderer			(DE_NULL)
	, m_referenceRenderer	(DE_NULL)
	, m_refColorBuffer		(DE_NULL)
	, m_viewportW			(0)
	, m_viewportH			(0)
{
	DE_ASSERT(!m_paramSets.empty());
	for (int i = 0; i < (int)m_paramSets.size(); i++)
		DE_ASSERT(m_paramSets[i].dstFuncRGB != GL_SRC_ALPHA_SATURATE && m_paramSets[i].dstFuncAlpha != GL_SRC_ALPHA_SATURATE);
}